

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O3

void __thiscall
TypeFactory::setCoreType(TypeFactory *this,string *name,int4 size,type_metatype meta,bool chartp)

{
  uint4 *puVar1;
  TypeCode *pTVar2;
  undefined3 in_register_00000081;
  
  if (CONCAT31(in_register_00000081,chartp) == 0) {
    if (meta == TYPE_VOID) {
      pTVar2 = (TypeCode *)getTypeVoid(this);
    }
    else if (meta == TYPE_CODE) {
      pTVar2 = getTypeCode(this,name);
    }
    else {
      pTVar2 = (TypeCode *)getBase(this,size,meta,name);
    }
  }
  else if (size == 1) {
    pTVar2 = (TypeCode *)getTypeChar(this,name);
  }
  else {
    pTVar2 = (TypeCode *)getTypeUnicode(this,name,size,meta);
  }
  puVar1 = &(pTVar2->super_Datatype).flags;
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  return;
}

Assistant:

void TypeFactory::setCoreType(const string &name,int4 size,
			      type_metatype meta,bool chartp)
{
  Datatype *ct;
  if (chartp) {
    if (size == 1)
      ct = getTypeChar(name);
    else
      ct = getTypeUnicode(name,size,meta);
  }
  else if (meta == TYPE_CODE)
    ct = getTypeCode(name);
  else if (meta == TYPE_VOID)
    ct = getTypeVoid();
  else
    ct = getBase(size,meta,name);
  ct->flags |= Datatype::coretype;
}